

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

void ucnv_extWriteFromU(UConverter *cnv,int32_t *cx,uint32_t value,char **target,char *targetLimit,
                       int32_t **offsets,int32_t srcIndex,UErrorCode *pErrorCode)

{
  uint8_t *__dest;
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint length;
  uint32_t uVar3;
  uint8_t buffer [32];
  
  length = value >> 0x18 & 0x1f;
  __dest = buffer + 1;
  if (length < 4) {
    puVar1 = __dest;
    puVar2 = __dest;
    if (length != 1) {
      if (length != 2) {
        if (length != 3) goto LAB_003016d4;
        buffer[1] = (uint8_t)(value >> 0x10);
        puVar1 = buffer + 2;
      }
      *puVar1 = (uint8_t)(value >> 8);
      puVar1 = puVar1 + 1;
    }
    *puVar1 = (uint8_t)value;
  }
  else {
    puVar2 = (uint8_t *)((long)cx + (long)cx[8] + (ulong)(value & 0xffffff));
  }
LAB_003016d4:
  uVar3 = cnv->fromUnicodeStatus;
  if (uVar3 != 0) {
    if (length == 1 && 1 < (int)uVar3) {
      buffer[0] = '\x0f';
      uVar3 = 1;
    }
    else {
      if (length < 2 || uVar3 != 1) goto LAB_00301730;
      buffer[0] = '\x0e';
      uVar3 = 2;
    }
    cnv->fromUnicodeStatus = uVar3;
    if (puVar2 != __dest) {
      memcpy(__dest,puVar2,(ulong)length);
    }
    length = length + 1;
    puVar2 = buffer;
  }
LAB_00301730:
  ucnv_fromUWriteBytes_63(cnv,(char *)puVar2,length,target,targetLimit,offsets,srcIndex,pErrorCode);
  return;
}

Assistant:

static inline void
ucnv_extWriteFromU(UConverter *cnv, const int32_t *cx,
                   uint32_t value,
                   char **target, const char *targetLimit,
                   int32_t **offsets, int32_t srcIndex,
                   UErrorCode *pErrorCode) {
    uint8_t buffer[1+UCNV_EXT_MAX_BYTES];
    const uint8_t *result;
    int32_t length, prevLength;

    length=UCNV_EXT_FROM_U_GET_LENGTH(value);
    value=(uint32_t)UCNV_EXT_FROM_U_GET_DATA(value);

    /* output the result */
    if(length<=UCNV_EXT_FROM_U_MAX_DIRECT_LENGTH) {
        /*
         * Generate a byte array and then write it below.
         * This is not the fastest possible way, but it should be ok for
         * extension mappings, and it is much simpler.
         * Offset and overflow handling are only done once this way.
         */
        uint8_t *p=buffer+1; /* reserve buffer[0] for shiftByte below */
        switch(length) {
        case 3:
            *p++=(uint8_t)(value>>16);
            U_FALLTHROUGH;
        case 2:
            *p++=(uint8_t)(value>>8);
            U_FALLTHROUGH;
        case 1:
            *p++=(uint8_t)value;
            U_FALLTHROUGH;
        default:
            break; /* will never occur */
        }
        result=buffer+1;
    } else {
        result=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_BYTES_INDEX, uint8_t)+value;
    }

    /* with correct data we have length>0 */

    if((prevLength=cnv->fromUnicodeStatus)!=0) {
        /* handle SI/SO stateful output */
        uint8_t shiftByte;

        if(prevLength>1 && length==1) {
            /* change from double-byte mode to single-byte */
            shiftByte=(uint8_t)UCNV_SI;
            cnv->fromUnicodeStatus=1;
        } else if(prevLength==1 && length>1) {
            /* change from single-byte mode to double-byte */
            shiftByte=(uint8_t)UCNV_SO;
            cnv->fromUnicodeStatus=2;
        } else {
            shiftByte=0;
        }

        if(shiftByte!=0) {
            /* prepend the shift byte to the result bytes */
            buffer[0]=shiftByte;
            if(result!=buffer+1) {
                uprv_memcpy(buffer+1, result, length);
            }
            result=buffer;
            ++length;
        }
    }

    ucnv_fromUWriteBytes(cnv, (const char *)result, length,
                         target, targetLimit,
                         offsets, srcIndex,
                         pErrorCode);
}